

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<long_double>::Decompose_Cholesky(TPZMatrix<long_double> *this)

{
  char cVar1;
  int iVar2;
  int extraout_var;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar9;
  longdouble in_ST5;
  longdouble lVar10;
  longdouble in_ST6;
  longdouble lVar11;
  longdouble local_68;
  longdouble local_58;
  long local_48;
  longdouble local_3c;
  long lVar3;
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar1 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0 && -1 < extraout_var) {
      local_3c = (longdouble)1e-16;
      lVar4 = 0;
      lVar8 = in_ST6;
      do {
        if (lVar4 != 0) {
          lVar5 = 0;
          lVar7 = in_ST2;
          lVar9 = in_ST5;
          do {
            in_ST5 = lVar8;
            in_ST2 = lVar9;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5)
            ;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5)
            ;
            lVar8 = in_ST0 * in_ST1;
            in_ST0 = in_ST3;
            in_ST1 = in_ST4;
            in_ST3 = in_ST6;
            in_ST4 = in_ST5;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4)
            ;
            local_58 = lVar7 - ((longdouble)0 + lVar8);
            in_ST6 = in_ST5;
            lVar8 = in_ST5;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar4,lVar4,&local_58);
            lVar5 = lVar5 + 1;
            lVar7 = in_ST2;
            lVar9 = in_ST5;
          } while (lVar4 != lVar5);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
        lVar7 = lVar8;
        sqrtl();
        lVar9 = lVar7;
        local_58 = in_ST1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar4,lVar4,&local_58,in_R8,in_R9,in_ST0);
        lVar5 = lVar4 + 1;
        local_48 = lVar5;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = in_ST6;
        in_ST5 = lVar8;
        in_ST6 = lVar7;
        lVar8 = lVar9;
        for (; lVar5 < lVar3; lVar5 = lVar5 + 1) {
          if (lVar4 != 0) {
            lVar6 = 0;
            lVar7 = in_ST2;
            lVar9 = in_ST5;
            do {
              in_ST5 = lVar8;
              in_ST2 = lVar9;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar4,lVar6);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar5,lVar6);
              lVar8 = in_ST0 * in_ST1;
              in_ST0 = in_ST3;
              in_ST1 = in_ST4;
              in_ST3 = in_ST6;
              in_ST4 = in_ST5;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar4,lVar5);
              local_68 = lVar7 - ((longdouble)0 + lVar8);
              in_ST6 = in_ST5;
              lVar8 = in_ST5;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,lVar4,lVar5,&local_68);
              lVar6 = lVar6 + 1;
              lVar7 = in_ST2;
              lVar9 = in_ST5;
            } while (lVar4 != lVar6);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
          lVar7 = in_ST6;
          lVar9 = in_ST6;
          if (ABS(in_ST0) < local_3c) {
            Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
          local_68 = in_ST1 / in_ST2;
          lVar10 = lVar9;
          lVar11 = lVar9;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar5,&local_68);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5);
          lVar8 = lVar11;
          local_68 = in_ST3;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar4,&local_68);
          in_ST0 = in_ST4;
          in_ST1 = in_ST5;
          in_ST2 = in_ST6;
          in_ST3 = lVar7;
          in_ST4 = lVar9;
          in_ST5 = lVar10;
          in_ST6 = lVar11;
        }
        lVar4 = local_48;
      } while (local_48 != lVar3);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}